

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O2

int green_loop_release(green_loop_t_conflict loop)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  
  if (loop == (green_loop_t_conflict)0x0) {
    pcVar2 = "loop != ((void*)0)";
    uVar3 = 0xaf;
  }
  else {
    iVar1 = loop->refs;
    if (0 < iVar1) {
      loop->refs = iVar1 + -1;
      if (iVar1 == 1) {
        if (loop->coroutines != 0) {
          pcVar2 = "loop->coroutines == 0";
          uVar3 = 0xb8;
          goto LAB_0010243e;
        }
        free(loop);
      }
      return 0;
    }
    pcVar2 = "loop->refs > 0";
    uVar3 = 0xb0;
  }
LAB_0010243e:
  fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n",pcVar2,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
          ,uVar3);
  fflush(_stderr);
  abort();
}

Assistant:

int green_loop_release(green_loop_t loop)
{
    green_assert(loop != NULL);
    green_assert(loop->refs > 0);

    if (--(loop->refs) > 0) {
        return GREEN_SUCCESS;
    }

    green_assert(loop != NULL);

    green_assert(loop->coroutines == 0);
    green_free(loop);

    return GREEN_SUCCESS;
}